

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ParseInfoTree *pPVar5;
  ParserImpl *field_00;
  undefined8 in_RCX;
  long in_RDI;
  MessageFactory *factory;
  string delimiter;
  ParseInfoTree *parent;
  FieldDescriptor *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  string *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined7 in_stack_fffffffffffffef0;
  ParserImpl *in_stack_ffffffffffffff00;
  Reflection *this_00;
  undefined7 in_stack_ffffffffffffff10;
  Reflection *in_stack_ffffffffffffff18;
  allocator *paVar6;
  string local_d8 [32];
  string local_b8 [8];
  string *in_stack_ffffffffffffff50;
  ParserImpl *in_stack_ffffffffffffff58;
  Message *in_stack_ffffffffffffff60;
  ParserImpl *this_01;
  undefined1 local_88 [64];
  string local_48 [32];
  undefined8 local_28;
  byte local_1;
  
  iVar4 = *(int *)(in_RDI + 0xfc) + -1;
  *(int *)(in_RDI + 0xfc) = iVar4;
  if (iVar4 < 0) {
    paVar6 = (allocator *)(local_88 + 0x3f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Message is too deep",paVar6);
    ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)(local_88 + 0x3f));
    local_1 = 0;
    goto LAB_00440b21;
  }
  local_88._32_8_ = *(long *)(in_RDI + 0x10);
  local_28 = in_RCX;
  if (local_88._32_8_ != 0) {
    pPVar5 = CreateNested((ParseInfoTree *)
                          CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                          in_stack_fffffffffffffec8);
    *(ParseInfoTree **)(in_RDI + 0x10) = pPVar5;
  }
  this_00 = (Reflection *)local_88;
  std::__cxx11::string::string((string *)this_00);
  uVar1 = ConsumeMessageDelimiter(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if ((bool)uVar1) {
    if (*(long *)(in_RDI + 8) == 0) {
      field_00 = (ParserImpl *)0x0;
    }
    else {
      field_00 = (ParserImpl *)
                 (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),local_28);
      in_stack_ffffffffffffff00 = field_00;
    }
    this_01 = field_00;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x44095a);
    if (bVar2) {
      Reflection::AddMessage
                (this_00,(Message *)in_stack_ffffffffffffff00,(FieldDescriptor *)field_00,
                 (MessageFactory *)CONCAT17(bVar2,in_stack_fffffffffffffef0));
      std::__cxx11::string::string(local_b8,(string *)local_88);
      bVar3 = ConsumeMessage(this_01,in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_b8);
      if ((bVar3 & 1) != 0) goto LAB_00440ad0;
      local_1 = 0;
    }
    else {
      Reflection::MutableMessage
                (in_stack_ffffffffffffff18,(Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10),
                 (FieldDescriptor *)this_00,(MessageFactory *)in_stack_ffffffffffffff00);
      std::__cxx11::string::string(local_d8,(string *)local_88);
      bVar3 = ConsumeMessage(this_01,in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_d8);
      if ((bVar3 & 1) == 0) {
        local_1 = 0;
      }
      else {
LAB_00440ad0:
        *(int *)(in_RDI + 0xfc) = *(int *)(in_RDI + 0xfc) + 1;
        *(undefined8 *)(in_RDI + 0x10) = local_88._32_8_;
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string((string *)local_88);
LAB_00440b21:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError("Message is too deep");
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }